

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateMultiplyLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,1,-1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateMultiplyLayer(const Specification::NeuralNetworkLayer& layer) {
    // 1 or more inputs
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, -1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    return Result();
}